

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

ptr<resp_msg> __thiscall nuraft::raft_server::handle_reconnect_req(raft_server *this,req_msg *req)

{
  _func_int **pp_Var1;
  pointer psVar2;
  int iVar3;
  iterator iVar4;
  _func_int *p_Var5;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  shared_ptr<nuraft::resp_msg> sVar7;
  ptr<resp_msg> pVar8;
  int32 srv_id;
  string local_48;
  ptr<peer> pp;
  
  srv_id = *(int32 *)(in_RDX + 0x14);
  local_48._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
  pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x1b;
  sVar7 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int&>
                    ((unsigned_long *)this,(msg_type *)&local_48,(int *)&pp,
                     (int *)&req->log_entries_);
  _Var6 = sVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (*(int *)&req[8].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
    iVar4 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(req + 6),&srv_id);
    if (iVar4.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x10));
      peer::schedule_reconnection
                ((peer *)CONCAT44(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr._4_4_,
                                  pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr._0_4_));
      pp_Var1 = this->_vptr_raft_server;
      p_Var5 = (_func_int *)(**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      pp_Var1[4] = p_Var5;
      *(undefined1 *)(pp_Var1 + 6) = 1;
      psVar2 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar2 != (pointer)0x0) {
        iVar3 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
        if (3 < iVar3) {
          psVar2 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_
                    (&local_48,"re-connection to peer %d scheduled",(ulong)(uint)srv_id);
          (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_reconnect_req",0x3b7,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      _Var6._M_pi = extraout_RDX_00;
      goto LAB_0021002f;
    }
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Var6._M_pi = extraout_RDX;
    if (psVar2 == (pointer)0x0) goto LAB_0021002f;
    iVar3 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var6._M_pi = extraout_RDX_02;
    if (iVar3 < 2) goto LAB_0021002f;
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_48,"cannot find peer %d to re-connect",(ulong)(uint)srv_id);
    (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar2,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
      ,"handle_reconnect_req",0x3af,&local_48);
  }
  else {
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar2 == (pointer)0x0) goto LAB_0021002f;
    iVar3 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var6._M_pi = extraout_RDX_01;
    if (iVar3 < 2) goto LAB_0021002f;
    psVar2 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_48,"this node is not a leader (upon re-connect req from peer %d)",
               (ulong)(uint)srv_id);
    (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar2,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
      ,"handle_reconnect_req",0x3a9,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  _Var6._M_pi = extraout_RDX_03;
LAB_0021002f:
  pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_reconnect_req(req_msg& req) {
    int32 srv_id = req.get_src();
    ptr<resp_msg> resp( cs_new<resp_msg>
                        ( state_->get_term(),
                          msg_type::reconnect_response,
                          id_,
                          srv_id ) );
    if (role_ != srv_role::leader) {
        p_er("this node is not a leader "
             "(upon re-connect req from peer %d)",
             srv_id);
        return resp;
    }

    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) {
        p_er("cannot find peer %d to re-connect", srv_id);
        return resp;
    }

    // Schedule re-connection.
    ptr<peer> pp = entry->second;
    pp->schedule_reconnection();
    resp->accept(log_store_->next_slot());
    p_in("re-connection to peer %d scheduled", srv_id);

    return resp;
}